

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

csc * triplet_to_csr(csc *T,c_int *TtoC)

{
  c_int cVar1;
  long lVar2;
  c_int *p_00;
  c_float *pcVar3;
  long lVar4;
  long lVar5;
  csc *w_00;
  c_int *c;
  long in_RSI;
  long in_RDI;
  csc *C;
  c_float *Tx;
  c_float *Cx;
  c_int *Tj;
  c_int *Ti;
  c_int *w;
  c_int *Cj;
  c_int *Cp;
  c_int k;
  c_int p;
  c_int nz;
  c_int n;
  c_int m;
  void *in_stack_ffffffffffffff78;
  csc *C_00;
  c_int triplet;
  c_int values;
  c_int in_stack_ffffffffffffffa8;
  c_int in_stack_ffffffffffffffb0;
  c_int *pcVar6;
  c_int in_stack_ffffffffffffffb8;
  long local_40;
  csc *local_8;
  
  cVar1 = *(c_int *)(in_RDI + 8);
  values = *(c_int *)(in_RDI + 0x20);
  triplet = *(c_int *)(in_RDI + 0x18);
  C_00 = *(csc **)(in_RDI + 0x28);
  lVar2 = *(long *)(in_RDI + 0x30);
  w_00 = csc_spalloc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     values,triplet);
  c = (c_int *)csc_calloc((c_int)w_00,(c_int)in_stack_ffffffffffffff78);
  if ((w_00 == (csc *)0x0) || (c == (c_int *)0x0)) {
    local_8 = csc_done(C_00,w_00,in_stack_ffffffffffffff78,0x10fede);
  }
  else {
    p_00 = w_00->p;
    pcVar6 = w_00->i;
    pcVar3 = w_00->x;
    for (local_40 = 0; local_40 < lVar2; local_40 = local_40 + 1) {
      lVar4 = *(long *)(values + local_40 * 8);
      c[lVar4] = c[lVar4] + 1;
    }
    csc_cumsum(p_00,c,cVar1);
    for (local_40 = 0; local_40 < lVar2; local_40 = local_40 + 1) {
      cVar1 = *(c_int *)(triplet + local_40 * 8);
      lVar4 = *(long *)(values + local_40 * 8);
      lVar5 = c[lVar4];
      c[lVar4] = lVar5 + 1;
      pcVar6[lVar5] = cVar1;
      if ((pcVar3 != (c_float *)0x0) &&
         (pcVar3[lVar5] = (c_float)(&C_00->nzmax)[local_40], in_RSI != 0)) {
        *(long *)(in_RSI + local_40 * 8) = lVar5;
      }
    }
    local_8 = csc_done(C_00,w_00,in_stack_ffffffffffffff78,0x110034);
  }
  return local_8;
}

Assistant:

csc* triplet_to_csr(const csc *T, c_int *TtoC) {
  c_int m, n, nz, p, k, *Cp, *Cj, *w, *Ti, *Tj;
  c_float *Cx, *Tx;
  csc     *C;

  m  = T->m;
  n  = T->n;
  Ti = T->i;
  Tj = T->p;
  Tx = T->x;
  nz = T->nz;
  C  = csc_spalloc(m, n, nz, Tx != OSQP_NULL, 0);     /* allocate result */
  w  = csc_calloc(m, sizeof(c_int));                  /* get workspace */

  if (!C || !w) return csc_done(C, w, OSQP_NULL, 0);  /* out of memory */

  Cp = C->p;
  Cj = C->i;
  Cx = C->x;

  for (k = 0; k < nz; k++) w[Ti[k]]++;  /* row counts */
  csc_cumsum(Cp, w, m);                 /* row pointers */

  for (k = 0; k < nz; k++) {
    Cj[p = w[Ti[k]]++] = Tj[k];         /* A(i,j) is the pth entry in C */

    if (Cx) {
      Cx[p] = Tx[k];

      if (TtoC != OSQP_NULL) TtoC[k] = p;  // Assign vector of indices
    }
  }
  return csc_done(C, w, OSQP_NULL, 1);     /* success; free w and return C */
}